

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

ssize_t readn(int fd,void *buff,size_t n)

{
  int *piVar1;
  size_t in_RDX;
  void *in_RSI;
  int in_EDI;
  char *ptr;
  ssize_t readSum;
  ssize_t nread;
  size_t nleft;
  void *local_40;
  long local_38;
  long local_30;
  size_t local_28;
  
  local_38 = 0;
  local_40 = in_RSI;
  local_28 = in_RDX;
  do {
    if (local_28 == 0) {
      return local_38;
    }
    local_30 = read(in_EDI,local_40,local_28);
    if (local_30 < 0) {
      piVar1 = __errno_location();
      if (*piVar1 != 4) {
        piVar1 = __errno_location();
        if (*piVar1 != 0xb) {
          return -1;
        }
        return local_38;
      }
      local_30 = 0;
    }
    else if (local_30 == 0) {
      return local_38;
    }
    local_38 = local_30 + local_38;
    local_28 = local_28 - local_30;
    local_40 = (void *)(local_30 + (long)local_40);
  } while( true );
}

Assistant:

ssize_t readn(int fd, void *buff, size_t n){
    size_t nleft = n;
    ssize_t nread = 0;
    ssize_t readSum = 0;
    char* ptr=(char*)buff;

    while (nleft>0) {
        if ((nread=read(fd, ptr, nleft))<0) {
            if (errno==EINTR) {
                nread=0;
            }else if (errno==EAGAIN) {
                return readSum;
            }else {
                return -1;
            }
        }else if (nread==0) {
            break;
        }
        readSum+=nread;
        nleft-=nread;
        ptr+=nread;
    }
    return readSum;
}